

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void P_FakeZMovement(AActor *mo)

{
  TObjPtr<AActor> *obj;
  bool bVar1;
  AActor *pAVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  (mo->__Pos).Z = (mo->Vel).Z + (mo->__Pos).Z;
  if (((mo->flags).Value & 0x4000) != 0) {
    obj = &mo->target;
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
    if ((pAVar2 != (AActor *)0x0) && (((mo->flags).Value & 0x1200000) == 0)) {
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
      dVar3 = AActor::Distance2D(mo,pAVar2,false);
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
      dVar4 = (mo->__Pos).Z;
      dVar5 = (pAVar2->Height * 0.5 + (pAVar2->__Pos).Z) - dVar4;
      if ((0.0 <= dVar5) || (dVar5 * -3.0 <= dVar3)) {
        if ((dVar5 <= 0.0) || (dVar5 * 3.0 <= dVar3)) goto LAB_00415ade;
        dVar4 = dVar4 + mo->FloatSpeed;
      }
      else {
        dVar4 = dVar4 - mo->FloatSpeed;
      }
      (mo->__Pos).Z = dVar4;
    }
  }
LAB_00415ade:
  if (((mo->player != (player_t *)0x0) && (((mo->flags).Value & 0x200) != 0)) &&
     (dVar4 = (mo->__Pos).Z, mo->floorz <= dVar4 && dVar4 != mo->floorz)) {
    bVar1 = AActor::IsNoClip2(mo);
    if (!bVar1) {
      dVar4 = fastsindeg((double)level.maptime * 4.5);
      (mo->__Pos).Z = dVar4 + (mo->__Pos).Z;
    }
  }
  dVar4 = (mo->__Pos).Z;
  dVar3 = mo->floorz;
  if (dVar4 <= dVar3) {
    (mo->__Pos).Z = dVar3;
    dVar4 = dVar3;
  }
  if (mo->ceilingz < dVar4 + mo->Height) {
    (mo->__Pos).Z = mo->ceilingz - mo->Height;
  }
  return;
}

Assistant:

void P_FakeZMovement(AActor *mo)
{
	//
	// adjust height
	//
	mo->AddZ(mo->Vel.Z);
	if ((mo->flags&MF_FLOAT) && mo->target)
	{ // float down towards target if too close
		if (!(mo->flags & MF_SKULLFLY) && !(mo->flags & MF_INFLOAT))
		{
			double dist = mo->Distance2D(mo->target);
			double delta = mo->target->Center() - mo->Z();
			if (delta < 0 && dist < -(delta * 3))
				mo->AddZ(-mo->FloatSpeed);
			else if (delta > 0 && dist < (delta * 3))
				mo->AddZ(mo->FloatSpeed);
		}
	}
	if (mo->player && mo->flags&MF_NOGRAVITY && (mo->Z() > mo->floorz) && !mo->IsNoClip2())
	{
		mo->AddZ(DAngle(4.5 * level.maptime).Sin());
	}

	//
	// clip movement
	//
	if (mo->Z() <= mo->floorz)
	{ // hit the floor
		mo->SetZ(mo->floorz);
	}

	if (mo->Top() > mo->ceilingz)
	{ // hit the ceiling
		mo->SetZ(mo->ceilingz - mo->Height);
	}
}